

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# func.h
# Opt level: O3

void __thiscall
GF2::BFunc<6ul>::To<GF2::MOLex<6ul>>(BFunc<6ul> *this,MP<6UL,_GF2::MOLex<6UL>_> *polyRight)

{
  uint uVar1;
  ulong uVar2;
  byte bVar3;
  WW<6UL> local_20;
  
  std::__cxx11::list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>::clear
            (&polyRight->super_list<GF2::MM<6UL>,_std::allocator<GF2::MM<6UL>_>_>);
  local_20._words[0] = (word  [1])0;
  while( true ) {
    uVar2 = 0;
    bVar3 = 0;
    do {
      bVar3 = bVar3 ^ (~uVar2 | (ulong)local_20._words[0]) == 0xffffffffffffffff & (byte)this[uVar2]
      ;
      uVar1 = (int)uVar2 + 1U & 0x3f;
      uVar2 = (ulong)uVar1;
    } while (uVar1 != 0);
    if (bVar3 != 0) {
      MP<6UL,_GF2::MOLex<6UL>_>::SymDiff(polyRight,(MM<6UL> *)&local_20);
    }
    if ((long)local_20._words[0] + 1U == 0) break;
    local_20._words[0] = (word  [1])((long)local_20._words[0] + 1U & 0x3f);
    if (local_20._words[0] == 0) {
      return;
    }
  }
  return;
}

Assistant:

void To(MP<_n, _O>& polyRight) const
	{	
		polyRight = 0;
		// цикл по мономам
		MM<_n> mon;
		do
		{
			bool bCoeff = 0;
			MM<_n> x;
			do bCoeff ^= x.Calc(mon) & Get(x);
			while (x.Next());
			if (bCoeff)
				polyRight += mon;
		}
		while(mon.Next());
	}